

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::ValidateProto3Message
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  long lVar1;
  string *element_name;
  Type *proto_00;
  Type *proto_01;
  Type *pTVar2;
  ulong uVar3;
  iterator iVar4;
  long *plVar5;
  mapped_type *ppFVar6;
  long *plVar7;
  size_type *psVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  string lowercase_name;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
  name_to_field;
  key_type local_128;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  string local_c8;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  DescriptorBuilder *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
  local_60;
  
  if (0 < *(int *)(message + 0x48)) {
    lVar10 = 0;
    lVar9 = 0;
    do {
      lVar1 = *(long *)(message + 0x50);
      proto_00 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                           (&(proto->nested_type_).super_RepeatedPtrFieldBase,(int)lVar9);
      ValidateProto3Message(this,(Descriptor *)(lVar1 + lVar10),proto_00);
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + 0xa8;
    } while (lVar9 < *(int *)(message + 0x48));
  }
  if (0 < *(int *)(message + 0x58)) {
    lVar10 = 0;
    lVar9 = 0;
    do {
      lVar1 = *(long *)(message + 0x60);
      proto_01 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                           (&(proto->enum_type_).super_RepeatedPtrFieldBase,(int)lVar9);
      ValidateProto3Enum(this,(EnumDescriptor *)(lVar1 + lVar10),proto_01);
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + 0x38;
    } while (lVar9 < *(int *)(message + 0x58));
  }
  if (0 < *(int *)(message + 0x2c)) {
    lVar10 = 0;
    lVar9 = 0;
    do {
      lVar1 = *(long *)(message + 0x30);
      pTVar2 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (&(proto->field_).super_RepeatedPtrFieldBase,(int)lVar9);
      ValidateProto3Field(this,(FieldDescriptor *)(lVar1 + lVar10),pTVar2);
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + 0xa8;
    } while (lVar9 < *(int *)(message + 0x2c));
  }
  if (0 < *(int *)(message + 0x78)) {
    lVar10 = 0;
    lVar9 = 0;
    do {
      lVar1 = *(long *)(message + 0x80);
      pTVar2 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (&(proto->extension_).super_RepeatedPtrFieldBase,(int)lVar9);
      ValidateProto3Field(this,(FieldDescriptor *)(lVar1 + lVar10),pTVar2);
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + 0xa8;
    } while (lVar9 < *(int *)(message + 0x78));
  }
  if (0 < *(int *)(message + 0x68)) {
    AddError(this,*(string **)(message + 8),&proto->super_Message,OTHER,
             "Extension ranges are not allowed in proto3.");
  }
  if (*(char *)(*(long *)(message + 0x20) + 0x68) == '\x01') {
    AddError(this,*(string **)(message + 8),&proto->super_Message,OTHER,
             "MessageSet is not supported in proto3.");
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < *(int *)(message + 0x2c)) {
    lVar9 = 0;
    do {
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      lVar10 = lVar9 * 0xa8;
      plVar5 = *(long **)(*(long *)(message + 0x30) + lVar10);
      local_128._M_string_length = 0;
      local_128.field_2._M_local_buf[0] = '\0';
      uVar3 = plVar5[1];
      if (uVar3 != 0) {
        uVar11 = 0;
        do {
          if (*(char *)(*plVar5 + uVar11) != '_') {
            std::__cxx11::string::push_back((char)&local_128);
            uVar3 = plVar5[1];
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < uVar3);
      }
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
              ::find(&local_60,&local_128);
      if ((_Rb_tree_header *)iVar4._M_node == &local_60._M_impl.super__Rb_tree_header) {
        lVar1 = *(long *)(message + 0x30);
        ppFVar6 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
                                *)&local_60,&local_128);
        *ppFVar6 = (mapped_type)(lVar1 + lVar10);
      }
      else {
        element_name = *(string **)(message + 8);
        std::operator+(&local_80,"The JSON camel-case name of field \"",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (*(long *)(message + 0x30) + lVar10));
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_80);
        plVar7 = plVar5 + 2;
        if ((long *)*plVar5 == plVar7) {
          local_98 = *plVar7;
          lStack_90 = plVar5[3];
          local_a8 = &local_98;
        }
        else {
          local_98 = *plVar7;
          local_a8 = (long *)*plVar5;
        }
        local_a0 = plVar5[1];
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        ppFVar6 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
                                *)&local_60,&local_128);
        plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_a8,**(ulong **)*ppFVar6);
        local_108 = &local_f8;
        plVar7 = plVar5 + 2;
        if ((long *)*plVar5 == plVar7) {
          local_f8 = *plVar7;
          lStack_f0 = plVar5[3];
        }
        else {
          local_f8 = *plVar7;
          local_108 = (long *)*plVar5;
        }
        local_100 = plVar5[1];
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_108);
        local_e8 = &local_d8;
        plVar7 = plVar5 + 2;
        if ((long *)*plVar5 == plVar7) {
          local_d8 = *plVar7;
          lStack_d0 = plVar5[3];
        }
        else {
          local_d8 = *plVar7;
          local_e8 = (long *)*plVar5;
        }
        local_e0 = plVar5[1];
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_e8);
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        psVar8 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_c8.field_2._M_allocated_capacity = *psVar8;
          local_c8.field_2._8_8_ = plVar5[3];
        }
        else {
          local_c8.field_2._M_allocated_capacity = *psVar8;
          local_c8._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_c8._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        AddError(local_88,element_name,&proto->super_Message,OTHER,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if (local_e8 != &local_d8) {
          operator_delete(local_e8,local_d8 + 1);
        }
        if (local_108 != &local_f8) {
          operator_delete(local_108,local_f8 + 1);
        }
        if (local_a8 != &local_98) {
          operator_delete(local_a8,local_98 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,
                        CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                                 local_128.field_2._M_local_buf[0]) + 1);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < *(int *)(message + 0x2c));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void DescriptorBuilder::ValidateProto3Message(
    Descriptor* message, const DescriptorProto& proto) {
  for (int i = 0; i < message->nested_type_count(); ++i) {
    ValidateProto3Message(message->nested_types_ + i,
                                 proto.nested_type(i));
  }
  for (int i = 0; i < message->enum_type_count(); ++i) {
    ValidateProto3Enum(message->enum_types_ + i,
                              proto.enum_type(i));
  }
  for (int i = 0; i < message->field_count(); ++i) {
    ValidateProto3Field(message->fields_ + i, proto.field(i));
  }
  for (int i = 0; i < message->extension_count(); ++i) {
    ValidateProto3Field(message->extensions_ +i, proto.extension(i));
  }
  if (message->extension_range_count() > 0) {
    AddError(message->full_name(), proto,
             DescriptorPool::ErrorCollector::OTHER,
             "Extension ranges are not allowed in proto3.");
  }
  if (message->options().message_set_wire_format()) {
    // Using MessageSet doesn't make sense since we disallow extensions.
    AddError(message->full_name(), proto,
             DescriptorPool::ErrorCollector::OTHER,
             "MessageSet is not supported in proto3.");
  }

  // In proto3, we reject field names if they conflict in camelCase.
  // Note that we currently enforce a stricter rule: Field names must be
  // unique after being converted to lowercase with underscores removed.
  std::map<string, const FieldDescriptor*> name_to_field;
  for (int i = 0; i < message->field_count(); ++i) {
    string lowercase_name = ToLowercaseWithoutUnderscores(
        message->field(i)->name());
    if (name_to_field.find(lowercase_name) != name_to_field.end()) {
      AddError(message->full_name(), proto,
               DescriptorPool::ErrorCollector::OTHER,
               "The JSON camel-case name of field \"" +
               message->field(i)->name() + "\" conflicts with field \"" +
               name_to_field[lowercase_name]->name() + "\". This is not " +
               "allowed in proto3.");
    } else {
      name_to_field[lowercase_name] = message->field(i);
    }
  }
}